

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_rand.c
# Opt level: O2

int BN_rand_range(BIGNUM *rnd,BIGNUM *range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  undefined8 extraout_RDX_02;
  
  iVar2 = 0;
  if ((range->neg == 0) && (iVar1 = BN_is_zero((BIGNUM *)range), iVar1 == 0)) {
    iVar2 = BN_num_bits(range);
    if (iVar2 == 1) {
      BN_zero_ex((BIGNUM *)rnd);
      iVar2 = 1;
    }
    else {
      iVar1 = BN_is_bit_set(range,iVar2 + -2);
      uVar4 = extraout_RDX;
      if ((iVar1 == 0) &&
         (iVar1 = BN_is_bit_set(range,iVar2 + -3), uVar4 = extraout_RDX_00, iVar1 == 0)) {
        iVar1 = -100;
        do {
          iVar3 = BN_rand(rnd,iVar2 + 1,(int)uVar4,in_ECX);
          if (iVar3 == 0) {
            return 0;
          }
          iVar3 = BN_cmp(rnd,range);
          if (-1 < iVar3) {
            iVar3 = BN_sub(rnd,rnd,range);
            if (iVar3 == 0) {
              return 0;
            }
            iVar3 = BN_cmp(rnd,range);
            if ((-1 < iVar3) && (iVar3 = BN_sub(rnd,rnd,range), iVar3 == 0)) {
              return 0;
            }
          }
          iVar1 = iVar1 + 1;
          if (iVar1 == 0) {
            return 0;
          }
          iVar3 = BN_cmp(rnd,range);
          uVar4 = extraout_RDX_02;
        } while (-1 < iVar3);
      }
      else {
        iVar1 = -100;
        do {
          iVar3 = BN_rand(rnd,iVar2,(int)uVar4,in_ECX);
          if (iVar3 == 0) {
            return 0;
          }
          iVar1 = iVar1 + 1;
          if (iVar1 == 0) {
            return 0;
          }
          iVar3 = BN_cmp(rnd,range);
          uVar4 = extraout_RDX_01;
        } while (-1 < iVar3);
      }
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int BN_rand_range(BIGNUM *r, const BIGNUM *range)
{
    int n;
    int count = 100;

    if (range->neg || BN_is_zero(range)) {
        //BNerr(BN_F_BN_RAND_RANGE, BN_R_INVALID_RANGE);
        return 0;
    }

    n = BN_num_bits(range);     /* n > 0 */

    /* BN_is_bit_set(range, n - 1) always holds */

    if (n == 1)
        BN_zero(r);
    else if (!BN_is_bit_set(range, n - 2) && !BN_is_bit_set(range, n - 3)) {
        /*
         * range = 100..._2, so 3*range (= 11..._2) is exactly one bit longer
         * than range
         */
        do {
            if (!BN_rand(r, n + 1))
                return 0;
            /*
             * If r < 3*range, use r := r MOD range (which is either r, r -
             * range, or r - 2*range). Otherwise, iterate once more. Since
             * 3*range = 11..._2, each iteration succeeds with probability >=
             * .75.
             */
            if (BN_cmp(r, range) >= 0) {
                if (!BN_sub(r, r, range))
                    return 0;
                if (BN_cmp(r, range) >= 0)
                    if (!BN_sub(r, r, range))
                        return 0;
            }

            if (!--count) {
                //BNerr(BN_F_BN_RAND_RANGE, BN_R_TOO_MANY_ITERATIONS);
                return 0;
            }

        }
        while (BN_cmp(r, range) >= 0);
    } else {
        do {
            /* range = 11..._2  or  range = 101..._2 */
            if (!BN_rand(r, n))
                return 0;

            if (!--count) {
                //BNerr(BN_F_BN_RAND_RANGE, BN_R_TOO_MANY_ITERATIONS);
                return 0;
            }
        }
        while (BN_cmp(r, range) >= 0);
    }

    bn_check_top(r);
    return 1;
}